

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglGLES2SharedRenderingPerfTests.cpp
# Opt level: O2

void __thiscall
deqp::egl::anon_unknown_0::SharedRenderingPerfCase::~SharedRenderingPerfCase
          (SharedRenderingPerfCase *this)

{
  ~SharedRenderingPerfCase(this);
  operator_delete(this,0xe8);
  return;
}

Assistant:

SharedRenderingPerfCase::~SharedRenderingPerfCase (void)
{
	deinit();
}